

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::sr::anon_unknown_0::TextureDerivateCase::createInstance
          (TextureDerivateCase *this,Context *context)

{
  TextureDerivateCaseInstance *this_00;
  UniformSetup *uniformSetup;
  Context *context_local;
  TextureDerivateCase *this_local;
  
  this_00 = (TextureDerivateCaseInstance *)operator_new(0x228);
  uniformSetup = de::details::
                 UniqueBase<const_vkt::sr::UniformSetup,_de::DefaultDeleter<const_vkt::sr::UniformSetup>_>
                 ::operator*(&(this->super_TriangleDerivateCase).super_ShaderRenderCase.
                              m_uniformSetup.
                              super_UniqueBase<const_vkt::sr::UniformSetup,_de::DefaultDeleter<const_vkt::sr::UniformSetup>_>
                            );
  TextureDerivateCaseInstance::TextureDerivateCaseInstance
            (this_00,context,uniformSetup,&(this->super_TriangleDerivateCase).m_definitions,
             &(this->super_TriangleDerivateCase).m_values,
             (TextureCaseValues *)&(this->super_TriangleDerivateCase).field_0x13c);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* TextureDerivateCase::createInstance (Context& context) const
{
	DE_ASSERT(m_uniformSetup != DE_NULL);
	return new TextureDerivateCaseInstance(context, *m_uniformSetup, m_definitions, m_values, m_textureValues);
}